

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error
astcenc_config_init(astcenc_profile profile,uint block_x,uint block_y,uint block_z,float quality,
                   uint flags,astcenc_config *configp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar5;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  astcenc_error aVar21;
  uint uVar22;
  astcenc_preset_config *paVar23;
  astcenc_preset_config *paVar24;
  astcenc_error aVar25;
  array<astcenc_preset_config,_6UL> *paVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  float fVar30;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float xprec_testval;
  
  auVar31._0_12_ = ZEXT412(0);
  auVar31._12_4_ = 0;
  auVar39 = ZEXT1632(auVar31);
  configp->tune_mse_overshoot = (float)auVar39._0_4_;
  configp->tune_2partition_early_out_limit_factor = (float)auVar39._4_4_;
  configp->tune_3partition_early_out_limit_factor = (float)auVar39._8_4_;
  configp->tune_2plane_early_out_limit_correlation = (float)auVar39._12_4_;
  configp->tune_search_mode0_enable = (float)auVar39._16_4_;
  *(int *)&configp->field_0x6c = auVar39._20_4_;
  configp->progress_callback = (astcenc_progress_callback)auVar39._24_8_;
  configp->tune_refinement_limit = auVar39._0_4_;
  configp->tune_candidate_limit = auVar39._4_4_;
  configp->tune_2partitioning_candidate_limit = auVar39._8_4_;
  configp->tune_3partitioning_candidate_limit = auVar39._12_4_;
  configp->tune_4partitioning_candidate_limit = auVar39._16_4_;
  configp->tune_db_limit = (float)auVar39._20_4_;
  configp->tune_mse_overshoot = (float)auVar39._24_4_;
  configp->tune_2partition_early_out_limit_factor = (float)auVar39._28_4_;
  auVar39 = ZEXT1632(auVar31);
  configp->cw_a_weight = (float)auVar39._0_4_;
  configp->a_scale_radius = auVar39._4_4_;
  configp->rgbm_m_scale = (float)auVar39._8_4_;
  configp->tune_partition_count_limit = auVar39._12_4_;
  configp->tune_2partition_index_limit = auVar39._16_4_;
  configp->tune_3partition_index_limit = auVar39._20_4_;
  configp->tune_4partition_index_limit = auVar39._24_4_;
  configp->tune_block_mode_limit = auVar39._28_4_;
  configp->profile = auVar39._0_4_;
  configp->flags = auVar39._4_4_;
  configp->block_x = auVar39._8_4_;
  configp->block_y = auVar39._12_4_;
  configp->block_z = auVar39._16_4_;
  configp->cw_r_weight = (float)auVar39._20_4_;
  configp->cw_g_weight = (float)auVar39._24_4_;
  configp->cw_b_weight = (float)auVar39._28_4_;
  uVar29 = block_z + (block_z == 0);
  aVar21 = validate_block_size(block_x,block_y,uVar29);
  if (aVar21 == ASTCENC_SUCCESS) {
    configp->block_x = block_x;
    configp->block_y = block_y;
    configp->block_z = uVar29;
    uVar29 = block_y * block_x * uVar29;
    fVar30 = logf((float)uVar29);
    aVar21 = ASTCENC_ERR_BAD_QUALITY;
    if ((0.0 <= quality) && (quality <= 100.0)) {
      fVar30 = fVar30 / 2.3025851;
      paVar26 = &preset_configs_low;
      if ((int)uVar29 < 0x40) {
        paVar26 = &preset_configs_mid;
      }
      paVar23 = preset_configs_high._M_elems;
      if (0x18 < (int)uVar29) {
        paVar23 = paVar26->_M_elems;
      }
      lVar27 = 0;
      auVar10._4_4_ = in_XMM0_Db;
      auVar10._0_4_ = quality;
      auVar10._8_4_ = in_XMM0_Dc;
      auVar10._12_4_ = in_XMM0_Dd;
      paVar24 = paVar23;
      do {
        if (quality <= ((astcenc_preset_config *)&paVar24->quality)->quality) goto LAB_00263c9e;
        lVar27 = lVar27 + 1;
        paVar24 = paVar24 + 1;
      } while (lVar27 != 6);
      lVar27 = 6;
LAB_00263c9e:
      lVar28 = 0;
      if (lVar27 != 0) {
        lVar28 = lVar27 + -1;
      }
      paVar24 = paVar23 + lVar28;
      astcenc_config_init::preset_configs = (array<astcenc_preset_config,_6UL> *)paVar23;
      if (lVar28 == lVar27) {
        uVar29 = paVar24->tune_2partition_index_limit;
        uVar22 = paVar24->tune_3partition_index_limit;
        uVar16 = paVar24->tune_4partition_index_limit;
        uVar17 = paVar24->tune_block_mode_limit;
        uVar18 = paVar24->tune_refinement_limit;
        uVar19 = paVar24->tune_candidate_limit;
        uVar20 = paVar24->tune_2partitioning_candidate_limit;
        configp->tune_partition_count_limit = paVar24->tune_partition_count_limit;
        configp->tune_2partition_index_limit = uVar29;
        configp->tune_3partition_index_limit = uVar22;
        configp->tune_4partition_index_limit = uVar16;
        configp->tune_block_mode_limit = uVar17;
        configp->tune_refinement_limit = uVar18;
        configp->tune_candidate_limit = uVar19;
        configp->tune_2partitioning_candidate_limit = uVar20;
        uVar29 = paVar24->tune_4partitioning_candidate_limit;
        configp->tune_3partitioning_candidate_limit = paVar24->tune_3partitioning_candidate_limit;
        configp->tune_4partitioning_candidate_limit = uVar29;
        uVar1 = paVar24->tune_db_limit_a_base;
        uVar6 = paVar24->tune_db_limit_b_base;
        auVar32._0_4_ = (float)uVar1 + fVar30 * -35.0;
        auVar32._4_4_ = (float)uVar6 + fVar30 * -19.0;
        auVar32._8_4_ = fVar30 * 0.0 + 0.0;
        auVar32._12_4_ = fVar30 * 0.0 + 0.0;
        auVar31 = vmovshdup_avx(auVar32);
        auVar31 = vmaxss_avx(auVar32,auVar31);
        configp->tune_db_limit = auVar31._0_4_;
        fVar30 = paVar24->tune_2partition_early_out_limit_factor;
        fVar40 = paVar24->tune_3partition_early_out_limit_factor;
        fVar44 = paVar24->tune_2plane_early_out_limit_correlation;
        configp->tune_mse_overshoot = paVar24->tune_mse_overshoot;
        configp->tune_2partition_early_out_limit_factor = fVar30;
        configp->tune_3partition_early_out_limit_factor = fVar40;
        configp->tune_2plane_early_out_limit_correlation = fVar44;
        fVar30 = paVar24->tune_search_mode0_enable;
      }
      else {
        fVar40 = paVar23[lVar27].quality - paVar24->quality;
        if (fVar40 <= 0.0) {
          __assert_fail("wt_range > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp"
                        ,0x21b,
                        "astcenc_error astcenc_config_init(astcenc_profile, unsigned int, unsigned int, unsigned int, float, unsigned int, astcenc_config *)"
                       );
        }
        auVar31 = vinsertps_avx(ZEXT416((uint)paVar23[lVar27].quality),auVar10,0x10);
        auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)paVar24->quality),0x10);
        auVar31 = vsubps_avx(auVar31,auVar10);
        auVar33._4_4_ = fVar40;
        auVar33._0_4_ = fVar40;
        auVar33._8_4_ = fVar40;
        auVar33._12_4_ = fVar40;
        auVar33 = vdivps_avx(auVar31,auVar33);
        auVar31 = vpinsrd_avx(ZEXT416(paVar23[lVar27].tune_block_mode_limit),
                              paVar24->tune_refinement_limit,1);
        auVar31 = vpinsrd_avx(auVar31,paVar23[lVar27].tune_candidate_limit,2);
        auVar31 = vpinsrd_avx(auVar31,paVar24->tune_2partitioning_candidate_limit,3);
        auVar34 = vshufps_avx(auVar33,auVar33,0xe1);
        auVar10 = vpinsrd_avx(ZEXT416(paVar23[lVar27].tune_partition_count_limit),
                              paVar24->tune_2partition_index_limit,1);
        auVar10 = vpinsrd_avx(auVar10,paVar23[lVar27].tune_3partition_index_limit,2);
        auVar10 = vpinsrd_avx(auVar10,paVar24->tune_4partition_index_limit,3);
        auVar39._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar10;
        auVar39._16_16_ = ZEXT116(1) * auVar31;
        auVar43._8_4_ = 0x4b000000;
        auVar43._0_8_ = 0x4b0000004b000000;
        auVar43._12_4_ = 0x4b000000;
        auVar43._16_4_ = 0x4b000000;
        auVar43._20_4_ = 0x4b000000;
        auVar43._24_4_ = 0x4b000000;
        auVar43._28_4_ = 0x4b000000;
        auVar11 = vpblendw_avx2(auVar39,auVar43,0xaa);
        auVar39 = vpsrld_avx2(auVar39,0x10);
        auVar46._8_4_ = 0x53000000;
        auVar46._0_8_ = 0x5300000053000000;
        auVar46._12_4_ = 0x53000000;
        auVar46._16_4_ = 0x53000000;
        auVar46._20_4_ = 0x53000000;
        auVar46._24_4_ = 0x53000000;
        auVar46._28_4_ = 0x53000000;
        auVar39 = vpblendw_avx2(auVar39,auVar46,0xaa);
        auVar47._8_4_ = 0x53000080;
        auVar47._0_8_ = 0x5300008053000080;
        auVar47._12_4_ = 0x53000080;
        auVar47._16_4_ = 0x53000080;
        auVar47._20_4_ = 0x53000080;
        auVar47._24_4_ = 0x53000080;
        auVar47._28_4_ = 0x53000080;
        auVar39 = vsubps_avx(auVar39,auVar47);
        auVar31 = vpinsrd_avx(ZEXT416(paVar24->tune_block_mode_limit),
                              paVar23[lVar27].tune_refinement_limit,1);
        auVar31 = vpinsrd_avx(auVar31,paVar24->tune_candidate_limit,2);
        auVar31 = vpinsrd_avx(auVar31,paVar23[lVar27].tune_2partitioning_candidate_limit,3);
        fVar40 = auVar34._0_4_;
        fVar44 = auVar34._4_4_;
        auVar10 = vpinsrd_avx(ZEXT416(paVar24->tune_partition_count_limit),
                              paVar23[lVar27].tune_2partition_index_limit,1);
        auVar10 = vpinsrd_avx(auVar10,paVar24->tune_3partition_index_limit,2);
        auVar10 = vpinsrd_avx(auVar10,paVar23[lVar27].tune_4partition_index_limit,3);
        auVar42._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar10;
        auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
        auVar12 = vpblendw_avx2(auVar42,auVar43,0xaa);
        auVar43 = vpsrld_avx2(auVar42,0x10);
        auVar43 = vpblendw_avx2(auVar43,auVar46,0xaa);
        auVar43 = vsubps_avx(auVar43,auVar47);
        fVar41 = auVar33._0_4_;
        fVar45 = auVar33._4_4_;
        auVar31 = vunpcklpd_avx(ZEXT416(paVar23[lVar27].tune_3partitioning_candidate_limit),
                                ZEXT416(paVar24->tune_4partitioning_candidate_limit));
        auVar10 = vunpcklpd_avx(ZEXT416(paVar24->tune_3partitioning_candidate_limit),
                                ZEXT416(paVar23[lVar27].tune_4partitioning_candidate_limit));
        auVar32 = vinsertps_avx(ZEXT416((uint)paVar24->tune_search_mode0_enable),
                                ZEXT416((uint)paVar23[lVar27].tune_search_mode0_enable),0x10);
        configp->tune_partition_count_limit =
             (int)(fVar40 * (auVar11._0_4_ + auVar39._0_4_) +
                   fVar41 * (auVar12._0_4_ + auVar43._0_4_) + 0.5);
        configp->tune_2partition_index_limit =
             (int)(fVar44 * (auVar11._4_4_ + auVar39._4_4_) +
                   fVar45 * (auVar12._4_4_ + auVar43._4_4_) + 0.5);
        configp->tune_3partition_index_limit =
             (int)(fVar40 * (auVar11._8_4_ + auVar39._8_4_) +
                   fVar41 * (auVar12._8_4_ + auVar43._8_4_) + 0.5);
        configp->tune_4partition_index_limit =
             (int)(fVar44 * (auVar11._12_4_ + auVar39._12_4_) +
                   fVar45 * (auVar12._12_4_ + auVar43._12_4_) + 0.5);
        configp->tune_block_mode_limit =
             (int)(fVar40 * (auVar11._16_4_ + auVar39._16_4_) +
                   fVar41 * (auVar12._16_4_ + auVar43._16_4_) + 0.5);
        configp->tune_refinement_limit =
             (int)(fVar44 * (auVar11._20_4_ + auVar39._20_4_) +
                   fVar45 * (auVar12._20_4_ + auVar43._20_4_) + 0.5);
        configp->tune_candidate_limit =
             (int)(fVar40 * (auVar11._24_4_ + auVar39._24_4_) +
                   fVar41 * (auVar12._24_4_ + auVar43._24_4_) + 0.5);
        configp->tune_2partitioning_candidate_limit =
             (int)(auVar11._28_4_ + auVar39._28_4_ + auVar12._28_4_ + auVar43._28_4_ + 0.5);
        auVar38._8_8_ = 0x4330000000000000;
        auVar38._0_8_ = 0x4330000000000000;
        auVar31 = vorpd_avx(auVar31,auVar38);
        auVar31 = vsubpd_avx(auVar31,auVar38);
        auVar31 = vcvtpd2ps_avx(auVar31);
        auVar10 = vorpd_avx(auVar10,auVar38);
        auVar10 = vsubpd_avx(auVar10,auVar38);
        auVar10 = vcvtpd2ps_avx(auVar10);
        auVar37._0_4_ = (int)(fVar40 * auVar31._0_4_ + fVar41 * auVar10._0_4_ + 0.5);
        auVar37._4_4_ = (int)(fVar44 * auVar31._4_4_ + fVar45 * auVar10._4_4_ + 0.5);
        auVar37._8_4_ = (int)(auVar34._8_4_ * auVar31._8_4_ + auVar33._8_4_ * auVar10._8_4_ + 0.5);
        auVar37._12_4_ =
             (int)(auVar34._12_4_ * auVar31._12_4_ + auVar33._12_4_ * auVar10._12_4_ + 0.5);
        uVar5 = vmovlps_avx(auVar37);
        configp->tune_3partitioning_candidate_limit = (int)uVar5;
        configp->tune_4partitioning_candidate_limit = (int)((ulong)uVar5 >> 0x20);
        uVar2 = paVar24->tune_db_limit_a_base;
        uVar7 = paVar24->tune_db_limit_b_base;
        uVar3 = paVar23[lVar27].tune_db_limit_a_base;
        uVar8 = paVar23[lVar27].tune_db_limit_b_base;
        auVar31 = vmovshdup_avx(auVar33);
        auVar36._0_4_ = fVar41 * (float)uVar2 + auVar31._0_4_ * (float)uVar3 + fVar30 * -35.0;
        auVar36._4_4_ = fVar41 * (float)uVar7 + auVar31._4_4_ * (float)uVar8 + fVar30 * -19.0;
        auVar36._8_4_ = fVar41 * 0.0 + auVar31._8_4_ * 0.0 + fVar30 * 0.0;
        auVar36._12_4_ = fVar41 * 0.0 + auVar31._12_4_ * 0.0 + fVar30 * 0.0;
        auVar31 = vmovshdup_avx(auVar36);
        auVar31 = vmaxss_avx(auVar36,auVar31);
        configp->tune_db_limit = auVar31._0_4_;
        fVar30 = paVar24->tune_2partition_early_out_limit_factor;
        fVar40 = paVar24->tune_3partition_early_out_limit_factor;
        fVar44 = paVar24->tune_2plane_early_out_limit_correlation;
        auVar31 = vshufps_avx(auVar33,auVar33,0x55);
        fVar13 = paVar23[lVar27].tune_2partition_early_out_limit_factor;
        fVar14 = paVar23[lVar27].tune_3partition_early_out_limit_factor;
        fVar15 = paVar23[lVar27].tune_2plane_early_out_limit_correlation;
        configp->tune_mse_overshoot =
             fVar41 * paVar24->tune_mse_overshoot +
             auVar31._0_4_ * paVar23[lVar27].tune_mse_overshoot;
        configp->tune_2partition_early_out_limit_factor = fVar41 * fVar30 + auVar31._4_4_ * fVar13;
        configp->tune_3partition_early_out_limit_factor = fVar41 * fVar40 + auVar31._8_4_ * fVar14;
        configp->tune_2plane_early_out_limit_correlation = fVar41 * fVar44 + auVar31._12_4_ * fVar15
        ;
        auVar34._0_4_ = fVar41 * auVar32._0_4_;
        auVar34._4_4_ = fVar45 * auVar32._4_4_;
        auVar34._8_4_ = auVar33._8_4_ * auVar32._8_4_;
        auVar34._12_4_ = auVar33._12_4_ * auVar32._12_4_;
        auVar31 = vhaddps_avx(auVar34,auVar34);
        fVar30 = auVar31._0_4_;
      }
      configp->tune_search_mode0_enable = fVar30;
      configp->cw_r_weight = 1.0;
      configp->cw_g_weight = 1.0;
      configp->cw_b_weight = 1.0;
      configp->cw_a_weight = 1.0;
      configp->a_scale_radius = 0;
      configp->rgbm_m_scale = 0.0;
      configp->profile = profile;
      if (ASTCENC_PRF_LDR < profile) {
        if (1 < profile - ASTCENC_PRF_HDR_RGB_LDR_A) {
          return ASTCENC_ERR_BAD_PROFILE;
        }
        configp->tune_db_limit = 999.0;
        configp->tune_search_mode0_enable = 0.0;
      }
      aVar21 = ASTCENC_ERR_BAD_FLAGS;
      if ((flags < 0x80) && ((flags & 0x41 & (flags & 0x41) - 1) == 0)) {
        aVar25 = ASTCENC_ERR_BAD_DECODE_MODE;
        if ((flags >> 1 & 1) == 0) {
          aVar25 = ASTCENC_SUCCESS;
        }
        aVar21 = ASTCENC_SUCCESS;
        if ((profile & ~ASTCENC_PRF_LDR) == ASTCENC_PRF_HDR_RGB_LDR_A) {
          aVar21 = aVar25;
        }
      }
      if (aVar21 == ASTCENC_SUCCESS) {
        if ((flags & 1) == 0) {
          if ((flags & 0x40) == 0) {
            if ((flags & 8) != 0) {
              configp->cw_r_weight = 0.675;
              configp->cw_g_weight = 1.3275;
              configp->cw_b_weight = 0.2475;
            }
          }
          else {
            configp->rgbm_m_scale = 5.0;
            configp->cw_a_weight = 10.0;
          }
        }
        else {
          uVar22 = configp->tune_partition_count_limit + 1;
          uVar29 = 4;
          if (uVar22 < 4) {
            uVar29 = uVar22;
          }
          configp->tune_partition_count_limit = uVar29;
          configp->cw_g_weight = 0.0;
          configp->cw_b_weight = 0.0;
          uVar4 = configp->tune_2partition_early_out_limit_factor;
          uVar9 = configp->tune_3partition_early_out_limit_factor;
          auVar35._0_4_ = (float)uVar4 * 1.5;
          auVar35._4_4_ = (float)uVar9 * 1.5;
          auVar35._8_8_ = 0;
          uVar5 = vmovlps_avx(auVar35);
          configp->tune_2partition_early_out_limit_factor = (float)(int)uVar5;
          configp->tune_3partition_early_out_limit_factor = (float)(int)((ulong)uVar5 >> 0x20);
          configp->tune_2plane_early_out_limit_correlation = 0.99;
          configp->tune_db_limit = configp->tune_db_limit * 1.03;
        }
        configp->flags = flags;
        aVar21 = ASTCENC_SUCCESS;
      }
    }
  }
  return aVar21;
}

Assistant:

static astcenc_error validate_cpu_float()
{
	if32 p;
	volatile float xprec_testval = 2.51f;
	p.f = xprec_testval + 12582912.0f;
	float q = p.f - 12582912.0f;

	if (q != 3.0f)
	{
		return ASTCENC_ERR_BAD_CPU_FLOAT;
	}

	return ASTCENC_SUCCESS;
}